

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

void __thiscall RenX_ServerListPlugin::updateServerList(RenX_ServerListPlugin *this)

{
  Server *pSVar1;
  byte bVar2;
  Server *pSVar3;
  const_reference ppSVar4;
  string local_90;
  string local_70;
  value_type local_40;
  Server *server;
  size_t index;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_18;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  RenX_ServerListPlugin *this_local;
  
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)this;
  RenX::getCore();
  RenX::Core::getServers();
  server = (Server *)0x0;
  local_18 = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&index;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_server_list_json,'[');
  do {
    pSVar1 = server;
    pSVar3 = (Server *)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_18);
    if (pSVar1 == pSVar3) {
LAB_001230ad:
      for (; pSVar1 = server,
          pSVar3 = (Server *)
                   std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_18),
          pSVar1 != pSVar3; server = server + 1) {
        ppSVar4 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::operator[]
                            (local_18,(size_type)server);
        local_40 = *ppSVar4;
        bVar2 = RenX::Server::isConnected();
        if (((bVar2 & 1) != 0) && (bVar2 = RenX::Server::isFullyConnected(), (bVar2 & 1) != 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(&this->m_server_list_json,',');
          server_as_json_abi_cxx11_(&local_90,this,local_40);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(&this->m_server_list_json,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&this->m_server_list_json,']');
      updateMetadata(this);
      std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector
                ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&index);
      return;
    }
    ppSVar4 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::operator[]
                        (local_18,(size_type)server);
    local_40 = *ppSVar4;
    bVar2 = RenX::Server::isConnected();
    if (((bVar2 & 1) != 0) && (bVar2 = RenX::Server::isFullyConnected(), (bVar2 & 1) != 0)) {
      server_as_json_abi_cxx11_(&local_70,this,local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&this->m_server_list_json,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      server = server + 1;
      goto LAB_001230ad;
    }
    server = server + 1;
  } while( true );
}

Assistant:

void RenX_ServerListPlugin::updateServerList() {
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;
	RenX::Server *server;

	// regenerate server_list_json

	m_server_list_json = '[';

	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			m_server_list_json += server_as_json(*server);

			++index;
			break;
		}
		++index;
	}
	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			m_server_list_json += ',';
			m_server_list_json += server_as_json(*server);
		}
		++index;
	}

	m_server_list_json += ']';

	// Also update metadata so that it reflects any changes
	updateMetadata();
}